

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O1

INTBOOL CheckActorFlag(AActor *owner,char *flagname,bool printerror)

{
  PClass *type;
  int iVar1;
  INTBOOL IVar2;
  char *in_RAX;
  char *pcVar3;
  undefined4 extraout_var;
  FFlagDef *fd;
  FString part1;
  FString local_38;
  
  local_38.Chars = in_RAX;
  pcVar3 = strchr(flagname,0x2e);
  if ((owner->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar1 = (**(owner->super_DThinker).super_DObject._vptr_DObject)(owner);
    (owner->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar1);
  }
  type = (owner->super_DThinker).super_DObject.Class;
  if (pcVar3 == (char *)0x0) {
    fd = FindFlag(type,flagname,(char *)0x0);
  }
  else {
    FString::FString(&local_38,flagname,(long)pcVar3 - (long)flagname);
    fd = FindFlag(type,local_38.Chars,pcVar3 + 1);
    FString::~FString(&local_38);
  }
  if (fd == (FFlagDef *)0x0) {
    IVar2 = 0;
    if (printerror) {
      IVar2 = 0;
      Printf("Unknown flag \'%s\' in \'%s\'\n",flagname,
             FName::NameData.NameArray[(type->super_PStruct).super_PNamedType.TypeName.Index].Text);
    }
  }
  else {
    IVar2 = CheckActorFlag(owner,fd);
  }
  return IVar2;
}

Assistant:

INTBOOL CheckActorFlag(const AActor *owner, const char *flagname, bool printerror)
{
	const char *dot = strchr (flagname, '.');
	FFlagDef *fd;
	const PClass *cls = owner->GetClass();

	if (dot != NULL)
	{
		FString part1(flagname, dot-flagname);
		fd = FindFlag (cls, part1, dot+1);
	}
	else
	{
		fd = FindFlag (cls, flagname, NULL);
	}

	if (fd != NULL)
	{
		return CheckActorFlag(owner, fd);
	}
	else
	{
		if (printerror) Printf("Unknown flag '%s' in '%s'\n", flagname, cls->TypeName.GetChars());
		return false;
	}
}